

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

void sesschan_notify_remote_exit(Seat *seat)

{
  Seat *ctx;
  SeatVtable *pSVar1;
  char *pcVar2;
  int iVar3;
  undefined4 uVar4;
  size_t sVar5;
  bool bVar6;
  ptrlen pVar7;
  char *sigmsg;
  char *local_40;
  void *local_38;
  
  pSVar1 = seat[0xac].vt;
  if (pSVar1 == (SeatVtable *)0x0) {
    return;
  }
  ctx = seat + -6;
  if (*(char *)&(seat[0xb4].vt)->stripctrl_new == '\0') {
    pVar7 = pty_backend_exit_signame((Backend *)pSVar1,&local_40);
    bVar6 = pVar7.len == 0;
    if (!bVar6) {
      local_38 = pVar7.ptr;
      if (local_40 == (char *)0x0) {
        local_40 = dupstr("");
      }
      pcVar2 = local_40;
      pSVar1 = ctx->vt;
      sVar5 = strlen(local_40);
      (**(code **)(pSVar1->output + 0x40))(pSVar1,local_38,pVar7.len,0,pcVar2,sVar5);
    }
    safefree(local_40);
  }
  else {
    iVar3 = pty_backend_exit_signum((Backend *)pSVar1);
    bVar6 = iVar3 < 0;
    if (!bVar6) {
      (**(code **)(ctx->vt->output + 0x48))(ctx->vt,iVar3,0,"",0);
      goto LAB_001158a8;
    }
  }
  if (bVar6) {
    pSVar1 = seat[-6].vt;
    uVar4 = (**(code **)((seat[0xac].vt)->output + 0x48))();
    (**(code **)(pSVar1->output + 0x38))(pSVar1,uVar4);
  }
LAB_001158a8:
  *(undefined1 *)((long)&seat[0xa6].vt + 2) = 1;
  queue_toplevel_callback(sesschan_check_close_callback,ctx);
  return;
}

Assistant:

static void sesschan_notify_remote_exit(Seat *seat)
{
    sesschan *sess = container_of(seat, sesschan, seat);

    if (!sess->backend)
        return;

    bool got_signal = false;
    if (!sess->ssc->exit_signal_numeric) {
        char *sigmsg;
        ptrlen signame = pty_backend_exit_signame(sess->backend, &sigmsg);

        if (signame.len) {
            if (!sigmsg)
                sigmsg = dupstr("");

            sshfwd_send_exit_signal(
                sess->c, signame, false, ptrlen_from_asciz(sigmsg));

            got_signal = true;
        }

        sfree(sigmsg);
    } else {
        int signum = pty_backend_exit_signum(sess->backend);

        if (signum >= 0) {
            sshfwd_send_exit_signal_numeric(sess->c, signum, false,
                                            PTRLEN_LITERAL(""));
            got_signal = true;
        }
    }

    if (!got_signal)
        sshfwd_send_exit_status(sess->c, backend_exitcode(sess->backend));

    sess->seen_exit = true;
    queue_toplevel_callback(sesschan_check_close_callback, sess);
}